

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O0

void __thiscall QPathEdit::QPathEdit(QPathEdit *this,PathMode pathMode,QWidget *parent,Style style)

{
  ConnectionType type;
  undefined4 uVar1;
  QLineEdit *pQVar2;
  QCompleter *this_00;
  QFileSystemModel *this_01;
  PathValidator *this_02;
  QFileDialog *this_03;
  QToolButton *pQVar3;
  QAction *this_04;
  QHBoxLayout *pQVar4;
  QSize local_1cc;
  int local_1c4;
  code *pcStack_1c0;
  int height;
  undefined8 uStack_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  Object local_1a0 [8];
  code *local_198;
  undefined8 uStack_190;
  code *local_188;
  undefined8 local_180;
  Object local_178 [8];
  code *local_170;
  undefined8 uStack_168;
  code *local_160;
  undefined8 local_158;
  Object local_150 [8];
  QFlags<Qt::AlignmentFlag> local_148;
  QFlags<Qt::AlignmentFlag> local_144;
  QMargins local_140;
  QHBoxLayout *local_130;
  QHBoxLayout *layout;
  undefined8 local_120;
  QPathEdit *local_118;
  Object local_110 [8];
  QString local_108;
  QString local_f0;
  code *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  undefined8 local_c0;
  Object local_b8 [15];
  undefined1 local_a9;
  QString local_a8;
  undefined1 local_90 [40];
  QString local_68;
  QString local_50;
  QFlags<Qt::WindowType> local_28;
  Style local_24;
  QWidget *pQStack_20;
  Style style_local;
  QWidget *parent_local;
  QPathEdit *pQStack_10;
  PathMode pathMode_local;
  QPathEdit *this_local;
  
  local_24 = style;
  pQStack_20 = parent;
  parent_local._4_4_ = pathMode;
  pQStack_10 = this;
  QFlags<Qt::WindowType>::QFlags(&local_28);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_28.i);
  *(undefined ***)this = &PTR_metaObject_001a3840;
  *(undefined ***)&this->field_0x10 = &PTR__QPathEdit_001a39f0;
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,&this->super_QWidget);
  this->edit = pQVar2;
  this_00 = (QCompleter *)operator_new(0x10);
  QCompleter::QCompleter(this_00,(QObject *)this);
  this->pathCompleter = this_00;
  this_01 = (QFileSystemModel *)operator_new(0x10);
  QFileSystemModel::QFileSystemModel(this_01,(QObject *)this);
  this->completerModel = this_01;
  this_02 = (PathValidator *)operator_new(0x18);
  PathValidator::PathValidator(this_02,(QObject *)this);
  this->pathValidator = this_02;
  this_03 = (QFileDialog *)operator_new(0x28);
  local_90[0xf] = 1;
  QString::QString(&local_50);
  QString::QString(&local_68);
  QString::QString((QString *)(local_90 + 0x10));
  QFileDialog::QFileDialog
            (this_03,&this->super_QWidget,&local_50,&local_68,(QString *)(local_90 + 0x10));
  local_90[0xf] = 0;
  QString::~QString((QString *)(local_90 + 0x10));
  QString::~QString(&local_68);
  QString::~QString(&local_50);
  this->dialog = this_03;
  QString::QString(&this->currentValidPath);
  this->wasPathValid = true;
  this->uiStyle = local_24;
  this->mode = ExistingFile;
  type = (ConnectionType)this;
  QStandardPaths::writableLocation(type + 0x78);
  this->allowEmpty = true;
  pQVar3 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar3,&this->super_QWidget);
  this->toolButton = pQVar3;
  this_04 = (QAction *)operator_new(0x10);
  local_a9 = 1;
  getDefaultIcon((QPathEdit *)local_90);
  tr(&local_a8,"Open File-Dialog",(char *)0x0,-1);
  QAction::QAction(this_04,(QIcon *)local_90,&local_a8,(QObject *)this);
  local_a9 = 0;
  QString::~QString(&local_a8);
  QIcon::~QIcon((QIcon *)local_90);
  this->dialogAction = this_04;
  this->hasCustomIcon = false;
  masterDialog((QDialog *)this->dialog);
  setPathMode(this,parent_local._4_4_);
  local_c8 = QFileDialog::fileSelected;
  local_c0 = 0;
  local_d8 = dialogFileSelected;
  uStack_d0 = 0;
  QObject::connect<void(QFileDialog::*)(QString_const&),void(QPathEdit::*)(QString_const&)>
            (local_b8,(offset_in_QFileDialog_to_subr)this->dialog,
             (Object *)QFileDialog::fileSelected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QString::QString(&local_f0,"");
  QFileSystemModel::setRootPath(&local_108);
  QString::~QString(&local_f0);
  QFileSystemModel::setNameFilterDisables(SUB81(this->completerModel,0));
  layout = (QHBoxLayout *)QFileSystemModel::directoryLoaded;
  local_120 = 0;
  local_118 = this;
  QObject::
  connect<void(QFileSystemModel::*)(QString_const&),QPathEdit::QPathEdit(QPathEdit::PathMode,QWidget*,QPathEdit::Style)::__0>
            (local_110,(offset_in_QFileSystemModel_to_subr)this->completerModel,
             (QObject *)QFileSystemModel::directoryLoaded,(anon_class_8_1_8991fb9c_for_function)0x0,
             (ConnectionType)this->pathCompleter);
  QMetaObject::Connection::~Connection((Connection *)local_110);
  QCompleter::setModel((QAbstractItemModel *)this->pathCompleter);
  pQVar4 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar4,&this->super_QWidget);
  local_130 = pQVar4;
  QMargins::QMargins(&local_140);
  QLayout::setContentsMargins((QMargins *)pQVar4);
  (**(code **)(*(long *)local_130 + 0x68))(local_130,0);
  pQVar4 = local_130;
  pQVar2 = this->edit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_144);
  QBoxLayout::addWidget((QWidget *)pQVar4,(int)pQVar2,(QFlags_conflict1 *)0x0);
  pQVar4 = local_130;
  pQVar3 = this->toolButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_148);
  QBoxLayout::addWidget((QWidget *)pQVar4,(int)pQVar3,(QFlags_conflict1 *)0x0);
  QWidget::setLayout((QLayout *)this);
  QObject::installEventFilter((QObject *)this->edit);
  QLineEdit::setCompleter((QCompleter *)this->edit);
  QLineEdit::setValidator((QValidator *)this->edit);
  QLineEdit::setDragEnabled(SUB81(this->edit,0));
  QLineEdit::setReadOnly(SUB81(this->edit,0));
  local_160 = QLineEdit::editingFinished;
  local_158 = 0;
  local_170 = editTextUpdate;
  uStack_168 = 0;
  QObject::connect<void(QLineEdit::*)(),void(QPathEdit::*)()>
            (local_150,(offset_in_QLineEdit_to_subr)this->edit,(Object *)QLineEdit::editingFinished,
             0,type);
  QMetaObject::Connection::~Connection((Connection *)local_150);
  local_188 = QLineEdit::textChanged;
  local_180 = 0;
  local_198 = updateValidInfo;
  uStack_190 = 0;
  QObject::connect<void(QLineEdit::*)(QString_const&),void(QPathEdit::*)(QString_const&)>
            (local_178,(offset_in_QLineEdit_to_subr)this->edit,(Object *)QLineEdit::textChanged,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_178);
  local_1b0 = QAction::triggered;
  local_1a8 = 0;
  pcStack_1c0 = showDialog;
  uStack_1b8 = 0;
  QObject::connect<void(QAction::*)(bool),void(QPathEdit::*)()>
            (local_1a0,(offset_in_QAction_to_subr)this->dialogAction,(Object *)QAction::triggered,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_1a0);
  QToolButton::setDefaultAction((QAction *)this->toolButton);
  local_1cc = (QSize)(**(code **)(*(long *)this->edit + 0x70))();
  local_1c4 = QSize::height(&local_1cc);
  QWidget::setFixedSize((int)this->toolButton,local_1c4);
  if (local_24 == JoinedButton) {
    QLineEdit::addAction((QAction *)this->edit,(ActionPosition)this->dialogAction);
  }
  else if (local_24 != NoButton) goto LAB_0013369f;
  (**(code **)(*(long *)this->toolButton + 0x68))(this->toolButton,0);
LAB_0013369f:
  QWidget::setTabOrder((QWidget *)this->edit,(QWidget *)this->toolButton);
  uVar1 = QWidget::focusPolicy();
  QWidget::setFocusPolicy(this,uVar1);
  QWidget::setFocusProxy(&this->super_QWidget);
  return;
}

Assistant:

QPathEdit::QPathEdit(QPathEdit::PathMode pathMode, QWidget *parent,
                     QPathEdit::Style style)
  : QWidget(parent)
  , edit(new QLineEdit(this))
  , pathCompleter(new QCompleter(this)),
	completerModel(new QFileSystemModel(this)),
	pathValidator(new PathValidator(this)),
	dialog(new QFileDialog(this)),
	currentValidPath(),
	wasPathValid(true),
	uiStyle(style),
	mode(ExistingFile),
	defaultDir(QStandardPaths::writableLocation(QStandardPaths::HomeLocation)),
	allowEmpty(true),
	toolButton(new QToolButton(this)),
	dialogAction(new QAction(getDefaultIcon(), tr("Open File-Dialog"), this)),
	hasCustomIcon(false)
{
	//setup dialog
	masterDialog(dialog);
	setPathMode(pathMode);
	connect(dialog, &QFileDialog::fileSelected, this, &QPathEdit::dialogFileSelected);

	//setup completer
	completerModel->setRootPath("");
	completerModel->setNameFilterDisables(false);
	connect(completerModel, &QFileSystemModel::directoryLoaded, pathCompleter,
          [this](QString){ pathCompleter->complete(); });
	pathCompleter->setModel(completerModel);

	//setup this
	QHBoxLayout *layout = new QHBoxLayout(this);
	layout->setContentsMargins(QMargins());
	layout->setSpacing(0);
	layout->addWidget(edit);
	layout->addWidget(toolButton);
	setLayout(layout);
	//setup lineedit
	edit->installEventFilter(this);
	edit->setCompleter(pathCompleter);
	edit->setValidator(pathValidator);
	edit->setDragEnabled(true);
	edit->setReadOnly(true);
	connect(edit, &QLineEdit::editingFinished, this, &QPathEdit::editTextUpdate);
	connect(edit, &QLineEdit::textChanged, this, &QPathEdit::updateValidInfo);
	//setup "button"
	connect(dialogAction, &QAction::triggered, this, &QPathEdit::showDialog);
	toolButton->setDefaultAction(dialogAction);
	int height = edit->sizeHint().height();
#ifdef Q_OS_WIN
	height += 2;
#endif
	toolButton->setFixedSize(height, height);
	switch(style) {
	  case JoinedButton:
		  edit->addAction(dialogAction, QLineEdit::TrailingPosition);
	  case NoButton:
		  toolButton->setVisible(false);
		  break;
	  default:
		  break;
	}

	QWidget::setTabOrder(edit, toolButton);
	setFocusPolicy(edit->focusPolicy());
	setFocusProxy(edit);
}